

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcp_echo_server.cpp
# Opt level: O0

void __thiscall
EchoServer::onMessage(EchoServer *this,KcpConnectionPtr *conn,string *message,Timestamp receiveTime)

{
  LogLevel LVar1;
  LogStream *this_00;
  self *this_01;
  KcpConnection *pKVar2;
  long lVar3;
  atomic<long> *paVar4;
  int in_R8D;
  SourceFile file;
  size_t len;
  undefined1 local_1030 [12];
  Logger local_1020;
  string *local_50;
  string *message_local;
  KcpConnectionPtr *conn_local;
  EchoServer *this_local;
  Timestamp receiveTime_local;
  
  local_50 = message;
  message_local = (string *)conn;
  conn_local = (KcpConnectionPtr *)this;
  this_local = (EchoServer *)receiveTime.m_microSecondsSinceEpoch;
  if ((this->m_mode == 1) && (LVar1 = sznet::Logger::logLevel(), (int)LVar1 < 3)) {
    sznet::Logger::SourceFile::SourceFile<115>
              ((SourceFile *)local_1030,
               (char (*) [115])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/kcp_echo/kcp_echo_server.cpp"
              );
    receiveTime.m_microSecondsSinceEpoch = 0x46;
    file._12_4_ = 0;
    file.m_data = (char *)local_1030._0_8_;
    file.m_size = local_1030._8_4_;
    sznet::Logger::Logger(&local_1020,file,0x46);
    this_00 = sznet::Logger::stream(&local_1020);
    this_01 = sznet::LogStream::operator<<(this_00,"server recv: ");
    sznet::LogStream::operator<<(this_01,local_50);
    sznet::Logger::~Logger(&local_1020);
  }
  pKVar2 = sznet::get_pointer<sznet::net::KcpConnection>
                     ((shared_ptr<sznet::net::KcpConnection> *)message_local);
  sznet::StringPiece::StringPiece((StringPiece *)&len,local_50);
  sznet::net::LengthHeaderCodec<std::shared_ptr<sznet::net::KcpConnection>_>::send
            (&this->m_codec,(int)pKVar2,(StringPiece *)&len,receiveTime.m_microSecondsSinceEpoch,
             in_R8D);
  lVar3 = std::__cxx11::string::size();
  paVar4 = &this->m_transferred;
  LOCK();
  receiveTime_local.m_microSecondsSinceEpoch = (paVar4->super___atomic_base<long>)._M_i;
  (paVar4->super___atomic_base<long>)._M_i = (paVar4->super___atomic_base<long>)._M_i + lVar3;
  UNLOCK();
  std::__atomic_base<long>::operator++(&(this->m_receivedMessages).super___atomic_base<long>);
  return;
}

Assistant:

void onMessage(const sznet::net::KcpConnectionPtr& conn, const sznet::string& message, sznet::Timestamp receiveTime)
    {
        if (m_mode == 1)
        {
            LOG_INFO << "server recv: " << message;
        }
        m_codec.send(get_pointer(conn), message);
        size_t len = message.size();
        m_transferred.fetch_add(len);
        ++m_receivedMessages;
        (void)receiveTime;
    }